

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyDeepScanLine.cpp
# Opt level: O1

void anon_unknown.dwarf_d1704::readCopyWriteTest(string *tempDir,int channelCount,int testTimes)

{
  float fVar1;
  PixelType PVar2;
  pointer pcVar3;
  size_t __n;
  PixelType PVar4;
  Array2D<void_*> *pAVar5;
  _Alloc_hider _Var6;
  char cVar7;
  ostream *poVar8;
  ulong size;
  string *psVar9;
  void *pvVar10;
  void *pvVar11;
  long lVar12;
  Header *pHVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  float *pfVar16;
  float *pfVar17;
  int *piVar18;
  ChannelList *this;
  ChannelList *pCVar19;
  void *pvVar20;
  long *plVar21;
  ushort uVar22;
  uint uVar23;
  undefined4 uVar24;
  uint uVar25;
  int i;
  int iVar26;
  ulong uVar27;
  ushort uVar28;
  ulong uVar29;
  int j_2;
  long lVar30;
  uint uVar31;
  int j_1;
  long lVar32;
  int j;
  long lVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar39;
  int iVar40;
  DeepScanLineOutputFile file;
  Array2D<void_*> *local_328;
  uint local_30c;
  int type;
  undefined4 uStack_2ec;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2e8;
  _Base_ptr local_2e0;
  _Base_ptr local_2d8;
  Array<Imf_3_4::Array2D<void_*>_> data;
  long local_2c0 [2];
  long local_2b0;
  string copy_filename;
  string source_filename;
  DeepFrameBuffer frameBuffer;
  Channel local_1f0 [56];
  stringstream ss;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  undefined1 local_1a8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  ios_base aiStack_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing files with ",0x13);
  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,channelCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," channels ",10);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,testTimes);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," times.",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::ostream::flush();
  source_filename._M_dataplus._M_p = (pointer)&source_filename.field_2;
  pcVar3 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&source_filename,pcVar3,pcVar3 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&source_filename);
  copy_filename._M_dataplus._M_p = (pointer)&copy_filename.field_2;
  pcVar3 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&copy_filename,pcVar3,pcVar3 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&copy_filename);
  if (0 < testTimes) {
    size = (ulong)(uint)channelCount;
    local_30c = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"generating ",0xb);
      std::ostream::flush();
      frameBuffer._map._M_t._M_impl._0_8_ = 0;
      Imf_3_4::Header::Header
                ((Header *)&ss,(Box *)(anonymous_namespace)::displayWindow,
                 (Box *)&(anonymous_namespace)::dataWindow,1.0,(Vec2 *)&frameBuffer,1.0,INCREASING_Y
                 ,local_30c % 3);
      Imf_3_4::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
      Imf_3_4::Header::~Header((Header *)&ss);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,local_30c % 3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      std::ostream::flush();
      if (DAT_001e9118._M_current != (anonymous_namespace)::channelTypes) {
        DAT_001e9118._M_current = (anonymous_namespace)::channelTypes;
      }
      if (0 < channelCount) {
        iVar26 = 0;
        do {
          type = random_int(3);
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          std::ostream::operator<<(local_1a8,iVar26);
          std::__cxx11::stringbuf::str();
          if (type == 0) {
            psVar9 = (string *)Imf_3_4::Header::channels();
            Imf_3_4::Channel::Channel(local_1f0,UINT,1,1,false);
            Imf_3_4::ChannelList::insert(psVar9,(Channel *)&frameBuffer);
          }
          if (type == 1) {
            psVar9 = (string *)Imf_3_4::Header::channels();
            Imf_3_4::Channel::Channel(local_1f0,HALF,1,1,false);
            Imf_3_4::ChannelList::insert(psVar9,(Channel *)&frameBuffer);
          }
          if (type == 2) {
            psVar9 = (string *)Imf_3_4::Header::channels();
            Imf_3_4::Channel::Channel(local_1f0,FLOAT,1,1,false);
            Imf_3_4::ChannelList::insert(psVar9,(Channel *)&frameBuffer);
          }
          if (DAT_001e9118._M_current == DAT_001e9120) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&(anonymous_namespace)::channelTypes,
                       DAT_001e9118,&type);
          }
          else {
            *DAT_001e9118._M_current = type;
            DAT_001e9118._M_current = DAT_001e9118._M_current + 1;
          }
          if ((_Base_ptr *)frameBuffer._map._M_t._M_impl._0_8_ !=
              &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)frameBuffer._map._M_t._M_impl._0_8_,
                            (ulong)((long)&(frameBuffer._map._M_t._M_impl.super__Rb_tree_header.
                                            _M_header._M_parent)->_M_color + 1));
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          std::ios_base::~ios_base(aiStack_138);
          iVar26 = iVar26 + 1;
        } while (channelCount != iVar26);
      }
      Imf_3_4::Header::setType((string *)(anonymous_namespace)::header);
      Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::Array(&data,size);
      if (0 < channelCount) {
        lVar32 = 0;
        do {
          pAVar5 = data._data;
          pvVar10 = operator_new__(0xf5e20);
          pvVar11 = *(void **)((long)&pAVar5->_data + lVar32);
          if (pvVar11 != (void *)0x0) {
            operator_delete__(pvVar11);
          }
          *(undefined8 *)((long)&pAVar5->_sizeX + lVar32) = 0xea;
          *(undefined8 *)((long)&pAVar5->_sizeY + lVar32) = 0x21a;
          *(void **)((long)&pAVar5->_data + lVar32) = pvVar10;
          lVar32 = lVar32 + 0x18;
        } while (size * 0x18 != lVar32);
      }
      pvVar11 = operator_new__(0x7af10);
      if ((anonymous_namespace)::sampleCount._16_8_ != 0) {
        operator_delete__((void *)(anonymous_namespace)::sampleCount._16_8_);
      }
      (anonymous_namespace)::sampleCount._0_8_ = 0xea;
      (anonymous_namespace)::sampleCount._8_8_ = 0x21a;
      (anonymous_namespace)::sampleCount._16_8_ = pvVar11;
      remove(source_filename._M_dataplus._M_p);
      Imf_3_4::DeepScanLineOutputFile::DeepScanLineOutputFile
                (&file,source_filename._M_dataplus._M_p,(Header *)(anonymous_namespace)::header,8);
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
      Imf_3_4::Slice::Slice
                ((Slice *)&ss,UINT,
                 (char *)((anonymous_namespace)::sampleCount._16_8_ +
                          (long)(anonymous_namespace)::dataWindow * -4 + (long)DAT_001e90f4 * -0x868
                         ),4,0x868,1,1,0.0,false,false);
      Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
      if (0 < channelCount) {
        lVar32 = 0x10;
        uVar27 = 0;
        do {
          PVar2 = (anonymous_namespace)::channelTypes[uVar27];
          PVar4 = (uint)(PVar2 != UINT) * 3;
          if (PVar2 == HALF) {
            PVar4 = PVar2;
          }
          if (PVar2 == FLOAT) {
            PVar4 = PVar2;
          }
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          std::ostream::operator<<(local_1a8,(int)uVar27);
          std::__cxx11::stringbuf::str();
          iVar26 = (anonymous_namespace)::channelTypes[uVar27];
          uVar29 = (ulong)(iVar26 == 0) << 2;
          if (iVar26 == 1) {
            uVar29 = 2;
          }
          if (iVar26 == 2) {
            uVar29 = 4;
          }
          Imf_3_4::DeepSlice::DeepSlice
                    ((DeepSlice *)local_1f0,PVar4,
                     (char *)(*(long *)((long)&(data._data)->_sizeX + lVar32) +
                              (long)(anonymous_namespace)::dataWindow * -8 +
                             (long)DAT_001e90f4 * -0x10d0),8,0x10d0,uVar29,1,1,0.0,false,false);
          Imf_3_4::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&type);
          if ((_Base_ptr *)CONCAT44(uStack_2ec,type) != &local_2e0) {
            operator_delete((_Base_ptr *)CONCAT44(uStack_2ec,type),
                            (ulong)((long)&local_2e0->_M_color + 1));
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          std::ios_base::~ios_base(aiStack_138);
          uVar27 = uVar27 + 1;
          lVar32 = lVar32 + 0x18;
        } while (size != uVar27);
      }
      Imf_3_4::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      lVar32 = 0;
      do {
        lVar33 = 0;
        do {
          iVar26 = random_int(10);
          lVar30 = (anonymous_namespace)::sampleCount._8_8_ * lVar32 * 4;
          *(int *)((anonymous_namespace)::sampleCount._16_8_ + lVar30 + lVar33 * 4) = iVar26 + 1;
          if (0 < channelCount) {
            uVar31 = (uint)((int)lVar33 + (int)lVar32 * 0x21a) % 0x801;
            fVar34 = (float)uVar31;
            uVar25 = (uint)fVar34 & 0x7fffff | 0x800000;
            cVar7 = (char)((uint)fVar34 >> 0x17);
            uVar23 = (uint)fVar34 >> 0xd & 0x3ff;
            uVar22 = (ushort)uVar23 | 0x7c00 | (ushort)(uVar23 == 0);
            uVar28 = (ushort)((int)fVar34 + 0x8000fff + (uint)(((uint)fVar34 >> 0xd & 1) != 0) >>
                             0xd);
            if (0x477fefff < (uint)fVar34) {
              uVar28 = 0x7c00;
            }
            if (fVar34 == INFINITY) {
              uVar22 = 0x7c00;
            }
            if ((uint)fVar34 < 0x7f800000) {
              uVar22 = uVar28;
            }
            uVar28 = (ushort)(0x80000000 < uVar25 << (cVar7 + 0xa2U & 0x1f)) +
                     (short)(uVar25 >> (0x7eU - cVar7 & 0x1f));
            if ((uint)fVar34 < 0x33000001) {
              uVar28 = 0;
            }
            if (0x387fffff < (uint)fVar34) {
              uVar28 = uVar22;
            }
            uVar27 = 0;
            do {
              if ((anonymous_namespace)::channelTypes[uVar27] == 0) {
                pvVar11 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_
                                                          + lVar30 + lVar33 * 4) << 2);
                data._data[uVar27]._data[data._data[uVar27]._sizeY * lVar32 + lVar33] = pvVar11;
              }
              if ((anonymous_namespace)::channelTypes[uVar27] == 1) {
                pvVar11 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_
                                                          + lVar30 + lVar33 * 4) * 2);
                data._data[uVar27]._data[data._data[uVar27]._sizeY * lVar32 + lVar33] = pvVar11;
              }
              if ((anonymous_namespace)::channelTypes[uVar27] == 2) {
                pvVar11 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_
                                                          + lVar30 + lVar33 * 4) << 2);
                data._data[uVar27]._data[data._data[uVar27]._sizeY * lVar32 + lVar33] = pvVar11;
              }
              piVar18 = (anonymous_namespace)::channelTypes;
              lVar12 = (anonymous_namespace)::sampleCount._16_8_ + lVar30;
              if (*(int *)(lVar12 + lVar33 * 4) != 0) {
                uVar29 = 0;
                do {
                  if (piVar18[uVar27] == 0) {
                    *(uint *)((long)data._data[uVar27]._data
                                    [data._data[uVar27]._sizeY * lVar32 + lVar33] + uVar29 * 4) =
                         uVar31;
                  }
                  iVar26 = piVar18[uVar27];
                  if (iVar26 == 2) {
                    *(float *)((long)data._data[uVar27]._data
                                     [data._data[uVar27]._sizeY * lVar32 + lVar33] + uVar29 * 4) =
                         fVar34;
                  }
                  else if (iVar26 == 1) {
                    *(ushort *)
                     ((long)data._data[uVar27]._data[data._data[uVar27]._sizeY * lVar32 + lVar33] +
                     uVar29 * 2) = uVar28;
                  }
                  uVar29 = uVar29 + 1;
                } while (uVar29 < *(uint *)(lVar12 + lVar33 * 4));
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 != size);
          }
          lVar33 = lVar33 + 1;
        } while (lVar33 != 0x21a);
        lVar32 = lVar32 + 1;
      } while (lVar32 != 0xea);
      Imf_3_4::DeepScanLineOutputFile::writePixels((int)&file);
      lVar32 = 0;
      do {
        lVar33 = 0;
        do {
          if (0 < channelCount) {
            lVar30 = 4;
            uVar27 = 0;
            do {
              if (((anonymous_namespace)::channelTypes[uVar27] == 0) &&
                 (pvVar11 = *(void **)(*(long *)((long)data._data + lVar30 * 4 + -8) * lVar32 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar30 * 4) +
                                      lVar33 * 8), pvVar11 != (void *)0x0)) {
                operator_delete__(pvVar11);
              }
              if (((anonymous_namespace)::channelTypes[uVar27] == 1) &&
                 (pvVar11 = *(void **)(*(long *)((long)data._data + lVar30 * 4 + -8) * lVar32 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar30 * 4) +
                                      lVar33 * 8), pvVar11 != (void *)0x0)) {
                operator_delete__(pvVar11);
              }
              if (((anonymous_namespace)::channelTypes[uVar27] == 2) &&
                 (pvVar11 = *(void **)(*(long *)((long)data._data + lVar30 * 4 + -8) * lVar32 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar30 * 4) +
                                      lVar33 * 8), pvVar11 != (void *)0x0)) {
                operator_delete__(pvVar11);
              }
              uVar27 = uVar27 + 1;
              lVar30 = lVar30 + 6;
            } while (size != uVar27);
          }
          lVar33 = lVar33 + 1;
        } while (lVar33 != 0x21a);
        lVar32 = lVar32 + 1;
      } while (lVar32 != 0xea);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_3_4::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
      Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::~Array(&data);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"copying ",8);
      std::ostream::flush();
      Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
                ((DeepScanLineInputFile *)&ss,source_filename._M_dataplus._M_p,8);
      remove(copy_filename._M_dataplus._M_p);
      _Var6 = copy_filename._M_dataplus;
      pHVar13 = (Header *)Imf_3_4::DeepScanLineInputFile::header();
      uVar24 = 8;
      Imf_3_4::DeepScanLineOutputFile::DeepScanLineOutputFile
                ((DeepScanLineOutputFile *)&frameBuffer,_Var6._M_p,pHVar13,8);
      Imf_3_4::DeepScanLineOutputFile::copyPixels((DeepScanLineInputFile *)&frameBuffer);
      Imf_3_4::DeepScanLineOutputFile::~DeepScanLineOutputFile
                ((DeepScanLineOutputFile *)&frameBuffer);
      if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
      }
      if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
                ((DeepScanLineInputFile *)&type,copy_filename._M_dataplus._M_p,8);
      Imf_3_4::DeepScanLineInputFile::header();
      puVar14 = (undefined8 *)Imf_3_4::Header::displayWindow();
      puVar15 = (undefined8 *)Imf_3_4::Header::displayWindow();
      iVar26 = -(uint)((int)*puVar15 == (int)*puVar14);
      iVar39 = -(uint)((int)((ulong)*puVar15 >> 0x20) == (int)((ulong)*puVar14 >> 0x20));
      auVar35._4_4_ = iVar26;
      auVar35._0_4_ = iVar26;
      auVar35._8_4_ = iVar39;
      auVar35._12_4_ = iVar39;
      iVar26 = movmskpd(uVar24,auVar35);
      if ((iVar26 != 3) ||
         (iVar39 = -(uint)((int)puVar15[1] == (int)puVar14[1]),
         iVar40 = -(uint)((int)((ulong)puVar15[1] >> 0x20) == (int)((ulong)puVar14[1] >> 0x20)),
         auVar36._4_4_ = iVar39, auVar36._0_4_ = iVar39, auVar36._8_4_ = iVar40,
         auVar36._12_4_ = iVar40, iVar39 = movmskpd((int)puVar15,auVar36), iVar39 != 3)) {
        __assert_fail("fileHeader.displayWindow () == header.displayWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xcf,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      puVar14 = (undefined8 *)Imf_3_4::Header::dataWindow();
      puVar15 = (undefined8 *)Imf_3_4::Header::dataWindow();
      iVar39 = -(uint)((int)*puVar15 == (int)*puVar14);
      iVar40 = -(uint)((int)((ulong)*puVar15 >> 0x20) == (int)((ulong)*puVar14 >> 0x20));
      auVar37._4_4_ = iVar39;
      auVar37._0_4_ = iVar39;
      auVar37._8_4_ = iVar40;
      auVar37._12_4_ = iVar40;
      iVar26 = movmskpd(iVar26,auVar37);
      if ((iVar26 != 3) ||
         (iVar26 = -(uint)((int)puVar15[1] == (int)puVar14[1]),
         iVar39 = -(uint)((int)((ulong)puVar15[1] >> 0x20) == (int)((ulong)puVar14[1] >> 0x20)),
         auVar38._4_4_ = iVar26, auVar38._0_4_ = iVar26, auVar38._8_4_ = iVar39,
         auVar38._12_4_ = iVar39, iVar26 = movmskpd((int)puVar15,auVar38), iVar26 != 3)) {
        __assert_fail("fileHeader.dataWindow () == header.dataWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xd0,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      pfVar16 = (float *)Imf_3_4::Header::pixelAspectRatio();
      fVar34 = *pfVar16;
      pfVar16 = (float *)Imf_3_4::Header::pixelAspectRatio();
      if ((fVar34 != *pfVar16) || (NAN(fVar34) || NAN(*pfVar16))) {
        __assert_fail("fileHeader.pixelAspectRatio () == header.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xd1,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      pfVar16 = (float *)Imf_3_4::Header::screenWindowCenter();
      pfVar17 = (float *)Imf_3_4::Header::screenWindowCenter();
      if ((((*pfVar16 != *pfVar17) || (NAN(*pfVar16) || NAN(*pfVar17))) ||
          (pfVar16[1] != pfVar17[1])) || (NAN(pfVar16[1]) || NAN(pfVar17[1]))) {
        __assert_fail("fileHeader.screenWindowCenter () == header.screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xd2,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      pfVar16 = (float *)Imf_3_4::Header::screenWindowWidth();
      fVar34 = *pfVar16;
      pfVar16 = (float *)Imf_3_4::Header::screenWindowWidth();
      if ((fVar34 != *pfVar16) || (NAN(fVar34) || NAN(*pfVar16))) {
        __assert_fail("fileHeader.screenWindowWidth () == header.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xd3,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      piVar18 = (int *)Imf_3_4::Header::lineOrder();
      iVar26 = *piVar18;
      piVar18 = (int *)Imf_3_4::Header::lineOrder();
      if (iVar26 != *piVar18) {
        __assert_fail("fileHeader.lineOrder () == header.lineOrder ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xd4,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      piVar18 = (int *)Imf_3_4::Header::compression();
      iVar26 = *piVar18;
      piVar18 = (int *)Imf_3_4::Header::compression();
      if (iVar26 != *piVar18) {
        __assert_fail("fileHeader.compression () == header.compression ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xd5,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      this = (ChannelList *)Imf_3_4::Header::channels();
      pCVar19 = (ChannelList *)Imf_3_4::Header::channels();
      cVar7 = Imf_3_4::ChannelList::operator==(this,pCVar19);
      if (cVar7 == '\0') {
        __assert_fail("fileHeader.channels () == header.channels ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xd6,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      puVar14 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
      puVar15 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
      __n = puVar14[1];
      if (__n != puVar15[1]) {
LAB_00145a12:
        __assert_fail("fileHeader.type () == header.type ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xd7,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      if (__n != 0) {
        iVar26 = bcmp((void *)*puVar14,(void *)*puVar15,__n);
        if (iVar26 != 0) goto LAB_00145a12;
      }
      pvVar11 = operator_new__(0x7af10);
      Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::Array
                ((Array<Imf_3_4::Array2D<void_*>_> *)&file,size);
      if (0 < channelCount) {
        lVar32 = 0;
        do {
          pvVar20 = operator_new__(0xf5e20);
          pvVar10 = *(void **)((long)&local_328->_data + lVar32);
          if (pvVar10 != (void *)0x0) {
            operator_delete__(pvVar10);
          }
          *(undefined8 *)((long)&local_328->_sizeX + lVar32) = 0xea;
          *(undefined8 *)((long)&local_328->_sizeY + lVar32) = 0x21a;
          *(void **)((long)&local_328->_data + lVar32) = pvVar20;
          lVar32 = lVar32 + 0x18;
        } while (size * 0x18 != lVar32);
      }
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
      Imf_3_4::Slice::Slice
                ((Slice *)&ss,UINT,
                 (char *)((long)pvVar11 +
                         (long)DAT_001e90f4 * -0x868 + (long)(anonymous_namespace)::dataWindow * -4)
                 ,4,0x868,1,1,0.0,false,false);
      Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
      if (0 < channelCount) {
        lVar32 = 0x10;
        uVar27 = 0;
        do {
          PVar2 = (anonymous_namespace)::channelTypes[uVar27];
          PVar4 = (uint)(PVar2 != UINT) * 3;
          if (PVar2 == HALF) {
            PVar4 = PVar2;
          }
          if (PVar2 == FLOAT) {
            PVar4 = PVar2;
          }
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          std::ostream::operator<<(local_1a8,(int)uVar27);
          std::__cxx11::stringbuf::str();
          iVar26 = (anonymous_namespace)::channelTypes[uVar27];
          uVar29 = (ulong)(iVar26 == 0) << 2;
          if (iVar26 == 1) {
            uVar29 = 2;
          }
          if (iVar26 == 2) {
            uVar29 = 4;
          }
          Imf_3_4::DeepSlice::DeepSlice
                    ((DeepSlice *)local_1f0,PVar4,
                     (char *)(*(long *)((long)&local_328->_sizeX + lVar32) +
                              (long)(anonymous_namespace)::dataWindow * -8 +
                             (long)DAT_001e90f4 * -0x10d0),8,0x10d0,uVar29,1,1,0.0,false,false);
          Imf_3_4::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&data);
          if ((long *)data._size != local_2c0) {
            operator_delete((void *)data._size,local_2c0[0] + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          std::ios_base::~ios_base(aiStack_138);
          uVar27 = uVar27 + 1;
          lVar32 = lVar32 + 0x18;
        } while (size != uVar27);
      }
      Imf_3_4::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)&type);
      Imf_3_4::DeepScanLineInputFile::readPixelSampleCounts
                ((int)(DeepFrameBuffer *)&type,DAT_001e90f4);
      iVar26 = DAT_001e90f4;
      local_2b0 = CONCAT44(local_2b0._4_4_,DAT_001e90fc);
      iVar39 = DAT_001e90fc - DAT_001e90f4;
      if (DAT_001e90f4 <= DAT_001e90fc) {
        lVar32 = (anonymous_namespace)::sampleCount._8_8_ * 4;
        lVar33 = 0;
        uVar27 = 0;
        pvVar10 = pvVar11;
        do {
          lVar30 = 0;
          do {
            if (*(int *)((long)pvVar10 + lVar30 * 4) !=
                *(int *)((anonymous_namespace)::sampleCount._16_8_ + lVar33 + lVar30 * 4)) {
              __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                            ,0x10b,"void (anonymous namespace)::readFile(const std::string &, int)")
              ;
            }
            lVar30 = lVar30 + 1;
          } while (lVar30 != 0x21a);
          lVar30 = 0;
          do {
            if (0 < channelCount) {
              lVar12 = 4;
              uVar29 = 0;
              do {
                if ((anonymous_namespace)::channelTypes[uVar29] == 0) {
                  pvVar20 = operator_new__((ulong)*(uint *)((long)pvVar11 +
                                                           lVar30 * 4 + uVar27 * 0x868) << 2);
                  *(void **)(*(long *)((long)local_328 + lVar12 * 4 + -8) * uVar27 * 8 +
                             *(long *)((long)&local_328->_sizeX + lVar12 * 4) + lVar30 * 8) =
                       pvVar20;
                }
                if ((anonymous_namespace)::channelTypes[uVar29] == 1) {
                  pvVar20 = operator_new__((ulong)*(uint *)((long)pvVar11 +
                                                           lVar30 * 4 + uVar27 * 0x868) * 2);
                  *(void **)(*(long *)((long)local_328 + lVar12 * 4 + -8) * uVar27 * 8 +
                             *(long *)((long)&local_328->_sizeX + lVar12 * 4) + lVar30 * 8) =
                       pvVar20;
                }
                if ((anonymous_namespace)::channelTypes[uVar29] == 2) {
                  pvVar20 = operator_new__((ulong)*(uint *)((long)pvVar11 +
                                                           lVar30 * 4 + uVar27 * 0x868) << 2);
                  *(void **)(*(long *)((long)local_328 + lVar12 * 4 + -8) * uVar27 * 8 +
                             *(long *)((long)&local_328->_sizeX + lVar12 * 4) + lVar30 * 8) =
                       pvVar20;
                }
                uVar29 = uVar29 + 1;
                lVar12 = lVar12 + 6;
              } while (size != uVar29);
            }
            lVar30 = lVar30 + 1;
          } while (lVar30 != 0x21a);
          uVar27 = uVar27 + 1;
          lVar33 = lVar33 + lVar32;
          pvVar10 = (void *)((long)pvVar10 + 0x868);
        } while (uVar27 != iVar39 + 1);
      }
      Imf_3_4::DeepScanLineInputFile::readPixels((int)&type,iVar26);
      lVar32 = 0;
      do {
        local_2b0 = lVar32 * 0x21a;
        lVar33 = 0;
        do {
          if (0 < channelCount) {
            iVar26 = (int)lVar33;
            uVar23 = (uint)(iVar26 + (int)local_2b0) % 0x801;
            fVar34 = (float)uVar23;
            uVar27 = 0;
            do {
              if (*(int *)((anonymous_namespace)::sampleCount._8_8_ * lVar32 * 4 +
                           (anonymous_namespace)::sampleCount._16_8_ + lVar33 * 4) != 0) {
                uVar29 = 0;
                do {
                  iVar39 = (int)lVar32;
                  if ((anonymous_namespace)::channelTypes[uVar27] == 0) {
                    pvVar10 = local_328[uVar27]._data[local_328[uVar27]._sizeY * lVar32 + lVar33];
                    if (*(uint *)((long)pvVar10 + uVar29 * 4) != uVar23) {
                      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,iVar26);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
                      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar39);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8," error, should be ",0x12);
                      poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar23);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", is ",5);
                      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8)
                      ;
                      std::ostream::put((char)poVar8);
                      std::ostream::flush();
                      std::ostream::flush();
                    }
                    if (*(uint *)((long)pvVar10 + uVar29 * 4) != uVar23) {
                      __assert_fail("value[l] == static_cast<unsigned int> (i * width + j) % 2049",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                                    ,0x12e,
                                    "void (anonymous namespace)::readFile(const std::string &, int)"
                                   );
                    }
                  }
                  if ((anonymous_namespace)::channelTypes[uVar27] == 1) {
                    pvVar10 = local_328[uVar27]._data[local_328[uVar27]._sizeY * lVar32 + lVar33];
                    fVar1 = *(float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)((long)pvVar10 + uVar29 * 2) * 4);
                    if ((fVar1 != fVar34) || (NAN(fVar1) || NAN(fVar34))) {
                      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,iVar26);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
                      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar39);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8," error, should be ",0x12);
                      poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar23);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", is ",5);
                      plVar21 = (long *)::operator<<(poVar8,(half)*(uint16_t *)
                                                                   ((long)pvVar10 + uVar29 * 2));
                      std::ios::widen((char)*(undefined8 *)(*plVar21 + -0x18) + (char)plVar21);
                      std::ostream::put((char)plVar21);
                      std::ostream::flush();
                      std::ostream::flush();
                    }
                    fVar1 = *(float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)
                                              ((long)local_328[uVar27]._data
                                                     [local_328[uVar27]._sizeY * lVar32 + lVar33] +
                                              uVar29 * 2) * 4);
                    if ((fVar1 != fVar34) || (NAN(fVar1) || NAN(fVar34))) {
                      __assert_fail("((half*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                                    ,0x13b,
                                    "void (anonymous namespace)::readFile(const std::string &, int)"
                                   );
                    }
                  }
                  if ((anonymous_namespace)::channelTypes[uVar27] == 2) {
                    pvVar10 = local_328[uVar27]._data[local_328[uVar27]._sizeY * lVar32 + lVar33];
                    fVar1 = *(float *)((long)pvVar10 + uVar29 * 4);
                    if ((fVar1 != fVar34) || (NAN(fVar1) || NAN(fVar34))) {
                      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,iVar26);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
                      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar39);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8," error, should be ",0x12);
                      poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar23);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", is ",5);
                      poVar8 = std::ostream::_M_insert<double>
                                         ((double)*(float *)((long)pvVar10 + uVar29 * 4));
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8)
                      ;
                      std::ostream::put((char)poVar8);
                      std::ostream::flush();
                      std::ostream::flush();
                    }
                    fVar1 = *(float *)((long)local_328[uVar27]._data
                                             [local_328[uVar27]._sizeY * lVar32 + lVar33] +
                                      uVar29 * 4);
                    if ((fVar1 != fVar34) || (NAN(fVar1) || NAN(fVar34))) {
                      __assert_fail("((float*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                                    ,0x147,
                                    "void (anonymous namespace)::readFile(const std::string &, int)"
                                   );
                    }
                  }
                  uVar29 = uVar29 + 1;
                } while (uVar29 < *(uint *)((anonymous_namespace)::sampleCount._8_8_ * lVar32 * 4 +
                                            (anonymous_namespace)::sampleCount._16_8_ + lVar33 * 4))
                ;
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 != size);
          }
          lVar33 = lVar33 + 1;
        } while (lVar33 != 0x21a);
        lVar32 = lVar32 + 1;
      } while (lVar32 != 0xea);
      lVar32 = 0;
      do {
        lVar33 = 0;
        do {
          if (0 < channelCount) {
            lVar30 = 4;
            uVar27 = 0;
            do {
              if (((anonymous_namespace)::channelTypes[uVar27] == 0) &&
                 (pvVar10 = *(void **)(*(long *)((long)local_328 + lVar30 * 4 + -8) * lVar32 * 8 +
                                       *(long *)((long)&local_328->_sizeX + lVar30 * 4) + lVar33 * 8
                                      ), pvVar10 != (void *)0x0)) {
                operator_delete__(pvVar10);
              }
              if (((anonymous_namespace)::channelTypes[uVar27] == 1) &&
                 (pvVar10 = *(void **)(*(long *)((long)local_328 + lVar30 * 4 + -8) * lVar32 * 8 +
                                       *(long *)((long)&local_328->_sizeX + lVar30 * 4) + lVar33 * 8
                                      ), pvVar10 != (void *)0x0)) {
                operator_delete__(pvVar10);
              }
              if (((anonymous_namespace)::channelTypes[uVar27] == 2) &&
                 (pvVar10 = *(void **)(*(long *)((long)local_328 + lVar30 * 4 + -8) * lVar32 * 8 +
                                       *(long *)((long)&local_328->_sizeX + lVar30 * 4) + lVar33 * 8
                                      ), pvVar10 != (void *)0x0)) {
                operator_delete__(pvVar10);
              }
              uVar27 = uVar27 + 1;
              lVar30 = lVar30 + 6;
            } while (size != uVar27);
          }
          lVar33 = lVar33 + 1;
        } while (lVar33 != 0x21a);
        lVar32 = lVar32 + 1;
      } while (lVar32 != 0xea);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::~Array((Array<Imf_3_4::Array2D<void_*>_> *)&file);
      operator_delete__(pvVar11);
      if (local_2d8 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8);
      }
      if (local_2e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2e8);
      }
      remove(source_filename._M_dataplus._M_p);
      remove(copy_filename._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      std::ostream::flush();
      local_30c = local_30c + 1;
    } while (local_30c != testTimes);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)copy_filename._M_dataplus._M_p != &copy_filename.field_2) {
    operator_delete(copy_filename._M_dataplus._M_p,copy_filename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)source_filename._M_dataplus._M_p != &source_filename.field_2) {
    operator_delete(source_filename._M_dataplus._M_p,
                    source_filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
readCopyWriteTest (const std::string& tempDir, int channelCount, int testTimes)
{
    cout << "Testing files with " << channelCount << " channels " << testTimes
         << " times." << endl
         << flush;

    std::string source_filename =
        tempDir + "imf_test_copy_deep_scanline_source.exr";
    std::string copy_filename =
        tempDir + "imf_test_copy_deep_scanline_copy.exr";

    for (int i = 0; i < testTimes; i++)
    {
        int         compressionIndex = i % 3;
        Compression compression;
        switch (compressionIndex)
        {
            case 0: compression = NO_COMPRESSION; break;
            case 1: compression = RLE_COMPRESSION; break;
            case 2: compression = ZIPS_COMPRESSION; break;
        }

        generateRandomFile (source_filename, channelCount, compression);
        copyFile (source_filename, copy_filename);
        readFile (copy_filename, channelCount);
        remove (source_filename.c_str ());
        remove (copy_filename.c_str ());
        cout << endl << flush;
    }
}